

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O0

void __thiscall
skiwi::environment<skiwi::environment_entry>::environment
          (environment<skiwi::environment_entry> *this,
          shared_ptr<skiwi::environment<skiwi::environment_entry>_> *outer)

{
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> *outer_local;
  environment<skiwi::environment_entry> *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
  ::map(&this->env);
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::shared_ptr(&this->p_outer,outer);
  return;
}

Assistant:

bool has(const std::string& name)
      {
      auto it = env.find(name);
      if (it != env.end())
        return true;
      auto p_outer_copy = p_outer;
      while (p_outer_copy)
        {
        it = p_outer_copy->env.find(name);
        if (it != p_outer_copy->env.end())
          return true;
        p_outer_copy = p_outer_copy->p_outer;
        }
      return false;
      }